

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::GetNode
          (TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>
           *this,FState *key)

{
  TValueTraits<FScriptPosition> local_29;
  Node *pNStack_28;
  TValueTraits<FScriptPosition> traits;
  Node *n;
  FState *key_local;
  TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_> *this_local
  ;
  
  pNStack_28 = FindKey(this,key);
  this_local = (TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>
                *)pNStack_28;
  if (pNStack_28 == (Node *)0x0) {
    pNStack_28 = NewKey(this,key);
    TValueTraits<FScriptPosition>::Init(&local_29,&(pNStack_28->Pair).Value);
    this_local = (TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>
                  *)pNStack_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}